

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FtFont.h
# Opt level: O0

void __thiscall
ft::Font::Font(Font *this,Library *library,string *fontFile,int ptsize,int faceIndex,bool monochrome
              )

{
  FT_Library pFVar1;
  FT_Fixed FVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  runtime_error *prVar7;
  undefined8 uVar8;
  Exception *pEVar9;
  ulong uVar10;
  long lVar11;
  undefined4 extraout_XMM0_Db;
  FT_Fixed scale;
  string local_b0;
  undefined1 local_8a;
  allocator local_89;
  string local_88;
  undefined1 local_62;
  allocator local_61;
  string local_60;
  int local_40;
  FT_Error error;
  undefined1 local_29;
  int local_28;
  int iStack_24;
  bool monochrome_local;
  int faceIndex_local;
  int ptsize_local;
  string *fontFile_local;
  Library *library_local;
  Font *this_local;
  
  this->library = library;
  this->face = (FT_Face_conflict)0x0;
  this->totalHeight = 0;
  this->monochrome_ = monochrome;
  local_29 = monochrome;
  local_28 = faceIndex;
  iStack_24 = ptsize;
  _faceIndex_local = fontFile;
  fontFile_local = (string *)library;
  library_local = (Library *)this;
  if (library->library == (FT_Library)0x0) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"Library is not initialized");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pFVar1 = library->library;
  uVar8 = std::__cxx11::string::c_str();
  local_40 = FT_New_Face(pFVar1,uVar8,(long)local_28,&this->face);
  if (local_40 == 2) {
    local_62 = 1;
    pEVar9 = (Exception *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_60,"Unsupported font format",&local_61);
    Exception::Exception(pEVar9,&local_60,local_40);
    local_62 = 0;
    __cxa_throw(pEVar9,&Exception::typeinfo,Exception::~Exception);
  }
  if (local_40 != 0) {
    local_8a = 1;
    pEVar9 = (Exception *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_88,"Couldn\'t load font file",&local_89);
    Exception::Exception(pEVar9,&local_88,local_40);
    local_8a = 0;
    __cxa_throw(pEVar9,&Exception::typeinfo,Exception::~Exception);
  }
  if (this->face->charmap == (FT_CharMap)0x0) {
    FT_Done_Face(this->face);
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"Font doesn\'t contain a Unicode charmap");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((this->face->face_flags & 1U) == 0) {
    if (this->face->num_fixed_sizes <= iStack_24) {
      iStack_24 = this->face->num_fixed_sizes + -1;
    }
    this->font_size_family = iStack_24;
    FT_Set_Pixel_Sizes(this->face,(int)this->face->available_sizes[iStack_24].width,
                       (int)this->face->available_sizes[iStack_24].height);
    this->height = (int)this->face->available_sizes[iStack_24].height;
    this->yMax = this->height;
    this->yMin = 0;
    this->ascent = this->height;
    this->descent = 0;
  }
  else {
    local_40 = FT_Set_Pixel_Sizes(this->face,iStack_24,iStack_24);
    if (local_40 != 0) {
      FT_Done_Face(this->face);
      scale._6_1_ = 1;
      pEVar9 = (Exception *)__cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_b0,"Couldn\'t set font size",(allocator *)((long)&scale + 7));
      Exception::Exception(pEVar9,&local_b0,local_40);
      scale._6_1_ = 0;
      __cxa_throw(pEVar9,&Exception::typeinfo,Exception::~Exception);
    }
    FVar2 = (this->face->size->metrics).y_scale;
    uVar10 = FT_MulFix((this->face->bbox).yMin,FVar2);
    auVar3._8_8_ = (long)uVar10 >> 0x3f;
    auVar3._0_8_ = uVar10 & 0xffffffffffffffc0;
    this->yMin = SUB164(auVar3 / SEXT816(0x40),0);
    lVar11 = FT_MulFix((this->face->bbox).yMax,FVar2,SUB168(auVar3 % SEXT816(0x40),0));
    auVar4._8_8_ = (long)(lVar11 + 0x3fU) >> 0x3f;
    auVar4._0_8_ = lVar11 + 0x3fU & 0xffffffffffffffc0;
    this->yMax = SUB164(auVar4 / SEXT816(0x40),0);
    lVar11 = std::lround((double)CONCAT44(extraout_XMM0_Db,
                                          (float)(this->face->size->metrics).height / 64.0));
    this->height = (int)lVar11;
    lVar11 = FT_MulFix((long)this->face->ascender,FVar2);
    auVar5._8_8_ = (long)(lVar11 + 0x3fU) >> 0x3f;
    auVar5._0_8_ = lVar11 + 0x3fU & 0xffffffffffffffc0;
    this->ascent = SUB164(auVar5 / SEXT816(0x40),0);
    uVar10 = FT_MulFix((long)this->face->descender,FVar2,SUB168(auVar5 % SEXT816(0x40),0));
    auVar6._8_8_ = (long)uVar10 >> 0x3f;
    auVar6._0_8_ = uVar10 & 0xffffffffffffffc0;
    this->descent = SUB164(auVar6 / SEXT816(0x40),0);
  }
  this->face_style = 0;
  if ((this->face->style_flags & 2U) != 0) {
    this->face_style = this->face_style | 1;
  }
  if ((this->face->style_flags & 1U) != 0) {
    this->face_style = this->face_style | 2;
  }
  this->style = this->face_style;
  this->outline = 0;
  this->kerning = 1;
  this->glyph_overhang = (this->face->size->metrics).y_ppem / 10;
  this->glyph_italics = 0.207;
  this->glyph_italics = (float)this->height * this->glyph_italics;
  this->totalHeight = this->yMax - this->yMin;
  return;
}

Assistant:

Font(Library& library, const std::string& fontFile, int ptsize, const int faceIndex, const bool monochrome)
        : library(library), monochrome_(monochrome)
    {
        if (!library.library)
            throw std::runtime_error("Library is not initialized");

        auto error = FT_New_Face(library.library, fontFile.c_str(), faceIndex, &face);
        if (error == FT_Err_Unknown_File_Format)
            throw Exception("Unsupported font format", error);
        if (error)
            throw Exception("Couldn't load font file", error);

        if (!face->charmap)
        {
            FT_Done_Face(face);
            throw std::runtime_error("Font doesn't contain a Unicode charmap");
        }

        if (FT_IS_SCALABLE(face))
        {
            /* Set the character size and use default DPI (72) */
            error = FT_Set_Pixel_Sizes(face, ptsize, ptsize);
            if (error) {
                FT_Done_Face(face);
                throw Exception("Couldn't set font size", error);
            }

            /* Get the scalable font metrics for this font */
            const auto scale = face->size->metrics.y_scale;
            yMin = FT_FLOOR(FT_MulFix(face->bbox.yMin, scale));
            yMax  = FT_CEIL(FT_MulFix(face->bbox.yMax, scale));
            // height  = FT_CEIL(FT_MulFix(face->height, scale));
            height =  std::lround(static_cast<float>(face->size->metrics.height) / static_cast<float>(1 << 6));
            //height =  std::lround(FT_MulFix(face->height, scale) / static_cast<float>(1 << 6));
            ascent = FT_CEIL(FT_MulFix(face->ascender, scale));
            //ascent = std::lround(FT_MulFix(face->ascender, scale) / static_cast<float>(1 << 6));
            descent = FT_FLOOR(FT_MulFix(face->descender, scale));
        }
        else
        {
            /* Non-scalable font case.  ptsize determines which family
             * or series of fonts to grab from the non-scalable format.
             * It is not the point size of the font.
             * */
            if (ptsize >= face->num_fixed_sizes)
                ptsize = face->num_fixed_sizes - 1;
            font_size_family = ptsize;
            error = FT_Set_Pixel_Sizes( face,
                                    static_cast<FT_UInt>(face->available_sizes[ptsize].width),
                                    static_cast<FT_UInt>(face->available_sizes[ptsize].height ));
            //TODO: check error, free font

            /* With non-scalale fonts, Freetype2 likes to fill many of the
             * font metrics with the value of 0.  The size of the
             * non-scalable fonts must be determined differently
             * or sometimes cannot be determined.
             * */
            height = face->available_sizes[ptsize].height;
            yMax = height;
            yMin = 0;
            ascent = height;
            descent = 0;
        }

        /* Initialize the font face style */
        face_style = TTF_STYLE_NORMAL;
        if (face->style_flags & FT_STYLE_FLAG_BOLD)
            face_style |= TTF_STYLE_BOLD;

        if (face->style_flags & FT_STYLE_FLAG_ITALIC)
            face_style |= TTF_STYLE_ITALIC;

        /* Set the default font style */
        style = face_style;
        outline = 0;
        kerning = 1;
        glyph_overhang = face->size->metrics.y_ppem / 10;
        /* x offset = cos(((90.0-12)/360)*2*M_PI), or 12 degree angle */
        glyph_italics = 0.207f;
        glyph_italics *= height;

        totalHeight = yMax - yMin;


    }